

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

matd_t * matd_plu_p(matd_plu_t *mlu)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  matd_t *pmVar4;
  matd_t *pmVar5;
  int i;
  ulong uVar6;
  
  pmVar4 = mlu->lu;
  uVar1 = pmVar4->nrows;
  pmVar5 = matd_create(uVar1,uVar1);
  uVar1 = pmVar4->nrows;
  for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
    uVar2 = pmVar5->ncols;
    uVar3 = mlu->piv[uVar6];
    pmVar5[(ulong)(uVar2 * uVar3 + (int)uVar6) + 1].nrows = 0;
    pmVar5[(ulong)(uVar2 * uVar3 + (int)uVar6) + 1].ncols = 0x3ff00000;
  }
  return pmVar5;
}

Assistant:

matd_t *matd_plu_p(const matd_plu_t *mlu)
{
    matd_t *lu = mlu->lu;
    matd_t *P = matd_create(lu->nrows, lu->nrows);

    for (int i = 0; i < lu->nrows; i++) {
        MATD_EL(P, mlu->piv[i], i) = 1;
    }

    return P;
}